

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O3

SpatialVector *
RigidBodyDynamics::CalcPointVelocity6D
          (SpatialVector *__return_storage_ptr__,Model *model,VectorNd *Q,VectorNd *QDot,
          uint body_id,Vector3d *point_position,bool update_kinematics)

{
  uint body_id_00;
  pointer pSVar1;
  pointer pFVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  Vector3d base_coords;
  Vector3d local_f8;
  SpatialTransform local_d8;
  Matrix3d local_78;
  
  uVar4 = (ulong)body_id;
  pSVar1 = (model->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(double *)
   ((long)&(pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = 0.0;
  *(double *)
   ((long)&(pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) = 0.0;
  *(double *)
   ((long)&(pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = 0.0;
  *(double *)
   ((long)&(pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18) = 0.0;
  *(undefined8 *)
   &(pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
  *(double *)
   ((long)&(pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
  if (update_kinematics) {
    UpdateKinematicsCustom(model,Q,QDot,(VectorNd *)0x0);
  }
  local_f8.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] =
       (point_position->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
       .m_storage.m_data.array[2];
  local_f8.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] =
       (point_position->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
       .m_storage.m_data.array[0];
  local_f8.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] =
       (point_position->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
       .m_storage.m_data.array[1];
  uVar3 = (ulong)(body_id - model->fixed_body_discriminator);
  if ((body_id != 0xffffffff && model->fixed_body_discriminator <= body_id) &&
     (pFVar2 = (model->mFixedBodies).
               super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               .
               super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               ._M_impl.super__Vector_impl_data._M_start,
     uVar5 = ((long)(model->mFixedBodies).
                    super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                    .
                    super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar2 >> 4) *
             -0x79435e50d79435e5, uVar3 <= uVar5 && uVar5 - uVar3 != 0)) {
    body_id_00 = pFVar2[uVar3].mMovableParent;
    CalcBodyToBaseCoordinates((Vector3d *)&local_d8,model,Q,body_id,point_position,false);
    CalcBaseToBodyCoordinates(&local_f8,model,Q,body_id_00,(Vector3d *)&local_d8,false);
    uVar4 = (ulong)body_id_00;
  }
  CalcBodyWorldOrientation(&local_78,model,Q,(uint)uVar4,false);
  local_d8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[0] =
       local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  local_d8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[1] =
       local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[3];
  local_d8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[2] =
       local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[6];
  local_d8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[3] =
       local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[1];
  local_d8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[4] =
       local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[4];
  local_d8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[5] =
       local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[7];
  local_d8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[6] =
       local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[2];
  local_d8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[7] =
       local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[5];
  local_d8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[8] =
       local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[8];
  local_d8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] =
       local_f8.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[0];
  local_d8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] =
       local_f8.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[1];
  local_d8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] =
       local_f8.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[2];
  Math::SpatialTransform::apply
            (&local_d8,
             (model->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start + uVar4);
  return __return_storage_ptr__;
}

Assistant:

RBDL_DLLAPI Math::SpatialVector CalcPointVelocity6D(
    Model &model,
    const Math::VectorNd &Q,
    const Math::VectorNd &QDot,
    unsigned int body_id,
    const Math::Vector3d &point_position,
    bool update_kinematics) {
  LOG << "-------- " << __func__ << " --------" << std::endl;
  assert (model.IsBodyId(body_id) || body_id == 0);
  assert (model.q_size == Q.size());
  assert (model.qdot_size == QDot.size());

  // Reset the velocity of the root body
  model.v[0].setZero();

  // update the Kinematics with zero acceleration
  if (update_kinematics) {
    UpdateKinematicsCustom (model, &Q, &QDot, NULL);
  }

  unsigned int reference_body_id = body_id;
  Vector3d reference_point = point_position;

  if (model.IsFixedBodyId(body_id)) {
    unsigned int fbody_id = body_id - model.fixed_body_discriminator;
    reference_body_id = model.mFixedBodies[fbody_id].mMovableParent;
    Vector3d base_coords = 
      CalcBodyToBaseCoordinates(model, Q, body_id, point_position, false);
    reference_point = 
      CalcBaseToBodyCoordinates(model, Q, reference_body_id, base_coords,false);
  }

  return SpatialTransform (
      CalcBodyWorldOrientation (model, Q, reference_body_id, false).transpose(), 
      reference_point).apply(model.v[reference_body_id]);
}